

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlCtxtGenericNodeCheck(xmlDebugCtxtPtr ctxt,xmlNodePtr node)

{
  _xmlDoc *p_Var1;
  _xmlDict *p_Var2;
  uchar *utf;
  int iVar3;
  xmlElementType xVar4;
  _xmlDoc *p_Var5;
  _xmlNode *p_Var6;
  xmlChar *pxVar7;
  xmlChar *extra;
  char *pcVar8;
  xmlNsPtr ns;
  xmlNs *ns_00;
  
  p_Var1 = node->doc;
  p_Var5 = p_Var1;
  if (node->parent == (_xmlNode *)0x0) {
    xmlDebugErr(ctxt,0x1395,"Node has no parent\n");
    p_Var5 = node->doc;
  }
  if (p_Var5 == (_xmlDoc *)0x0) {
    xmlDebugErr(ctxt,0x1396,"Node has no doc\n");
  }
  else {
    p_Var2 = p_Var1->dict;
    if ((p_Var2 == (_xmlDict *)0x0) && (ctxt->nodict == 0)) {
      ctxt->nodict = 1;
    }
    if (ctxt->doc == (xmlDocPtr)0x0) {
      ctxt->doc = p_Var1;
    }
    if (ctxt->dict == (xmlDictPtr)0x0) {
      ctxt->dict = p_Var2;
    }
  }
  if (((node->parent != (_xmlNode *)0x0) && (node->doc != node->parent->doc)) &&
     (iVar3 = xmlStrEqual(node->name,(xmlChar *)"pseudoroot"), iVar3 == 0)) {
    xmlDebugErr(ctxt,0x1399,"Node doc differs from parent\'s one\n");
  }
  if (node->prev == (_xmlNode *)0x0) {
    p_Var6 = node->parent;
    if (node->type == XML_ATTRIBUTE_NODE) {
      if ((p_Var6 != (_xmlNode *)0x0) && ((xmlNodePtr)p_Var6->properties != node)) {
        pcVar8 = "Attr has no prev and not first of attr list\n";
LAB_0014153a:
        iVar3 = 0x139a;
        goto LAB_00141542;
      }
    }
    else if ((p_Var6 != (_xmlNode *)0x0) && (p_Var6->children != node)) {
      pcVar8 = "Node has no prev and not first of parent list\n";
      goto LAB_0014153a;
    }
  }
  else {
    if (node->prev->next == node) goto LAB_00141547;
    pcVar8 = "Node prev->next : back link wrong\n";
    iVar3 = 0x139b;
LAB_00141542:
    xmlDebugErr(ctxt,iVar3,pcVar8);
  }
LAB_00141547:
  p_Var6 = node->next;
  if (p_Var6 == (_xmlNode *)0x0) {
    p_Var6 = node->parent;
    if ((((p_Var6 != (_xmlNode *)0x0) && (node->type != XML_ATTRIBUTE_NODE)) &&
        (p_Var6->last != node)) && (p_Var6->type == XML_ELEMENT_NODE)) {
      pcVar8 = "Node has no next and not last of parent list\n";
      iVar3 = 0x139c;
      goto LAB_00141587;
    }
  }
  else {
    if (p_Var6->prev != node) {
      xmlDebugErr(ctxt,0x139d,"Node next->prev : forward link wrong\n");
      p_Var6 = node->next;
    }
    if (p_Var6->parent != node->parent) {
      pcVar8 = "Node next->prev : forward link wrong\n";
      iVar3 = 0x13a5;
LAB_00141587:
      xmlDebugErr(ctxt,iVar3,pcVar8);
    }
  }
  xVar4 = node->type;
  if (xVar4 == XML_ATTRIBUTE_NODE) {
    ns = node->ns;
    if (ns == (xmlNsPtr)0x0) goto switchD_0014163c_caseD_1;
LAB_001415f9:
    xmlCtxtNsCheckScope(ctxt,node,ns);
LAB_00141604:
    xVar4 = node->type;
  }
  else if (xVar4 == XML_ELEMENT_NODE) {
    for (ns_00 = node->nsDef; ns_00 != (xmlNsPtr)0x0; ns_00 = ns_00->next) {
      xmlCtxtNsCheckScope(ctxt,node,ns_00);
    }
    ns = node->ns;
    if (ns != (xmlNsPtr)0x0) goto LAB_001415f9;
    goto LAB_00141604;
  }
  if (((XML_ATTRIBUTE_DECL < xVar4) ||
      ((0x1e206U >> (xVar4 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0)) &&
     ((utf = node->content, utf != (uchar *)0x0 &&
      ((ctxt->check != 0 && (iVar3 = xmlCheckUTF8(utf), iVar3 == 0)))))) {
    xmlDebugErr3(ctxt,0x13a8,"String is not UTF-8 %s",(char *)utf);
  }
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_ATTRIBUTE_NODE:
  case XML_PI_NODE:
switchD_0014163c_caseD_1:
    xmlCtxtCheckName(ctxt,node->name);
    return;
  case XML_TEXT_NODE:
    extra = node->name;
    if (extra != "textnoenc" && extra != "text") {
      if (ctxt->dict != (xmlDictPtr)0x0) {
        pxVar7 = xmlDictLookup(ctxt->dict,(xmlChar *)"nbktext",7);
        if (extra == pxVar7) {
          return;
        }
        extra = node->name;
      }
      pcVar8 = "Text node has wrong name \'%s\'";
      iVar3 = 0x13ac;
LAB_001416df:
      xmlDebugErr3(ctxt,iVar3,pcVar8,(char *)extra);
      return;
    }
    break;
  case XML_CDATA_SECTION_NODE:
    extra = node->name;
    if (extra != (xmlChar *)0x0) {
      pcVar8 = "CData section has non NULL name \'%s\'";
      iVar3 = 0x13ad;
      goto LAB_001416df;
    }
    break;
  case XML_COMMENT_NODE:
    extra = node->name;
    if (extra != "comment") {
      pcVar8 = "Comment node has wrong name \'%s\'";
      iVar3 = 0x13ac;
      goto LAB_001416df;
    }
  }
  return;
}

Assistant:

static void
xmlCtxtGenericNodeCheck(xmlDebugCtxtPtr ctxt, xmlNodePtr node) {
    xmlDocPtr doc;
    xmlDictPtr dict;

    doc = node->doc;

    if (node->parent == NULL)
        xmlDebugErr(ctxt, XML_CHECK_NO_PARENT,
	            "Node has no parent\n");
    if (node->doc == NULL) {
        xmlDebugErr(ctxt, XML_CHECK_NO_DOC,
	            "Node has no doc\n");
        dict = NULL;
    } else {
	dict = doc->dict;
	if ((dict == NULL) && (ctxt->nodict == 0)) {
#if 0
            /* deactivated right now as it raises too many errors */
	    if (doc->type == XML_DOCUMENT_NODE)
		xmlDebugErr(ctxt, XML_CHECK_NO_DICT,
			    "Document has no dictionary\n");
#endif
	    ctxt->nodict = 1;
	}
	if (ctxt->doc == NULL)
	    ctxt->doc = doc;

	if (ctxt->dict == NULL) {
	    ctxt->dict = dict;
	}
    }
    if ((node->parent != NULL) && (node->doc != node->parent->doc) &&
        (!xmlStrEqual(node->name, BAD_CAST "pseudoroot")))
        xmlDebugErr(ctxt, XML_CHECK_WRONG_DOC,
	            "Node doc differs from parent's one\n");
    if (node->prev == NULL) {
        if (node->type == XML_ATTRIBUTE_NODE) {
	    if ((node->parent != NULL) &&
	        (node != (xmlNodePtr) node->parent->properties))
		xmlDebugErr(ctxt, XML_CHECK_NO_PREV,
                    "Attr has no prev and not first of attr list\n");

        } else if ((node->parent != NULL) && (node->parent->children != node))
	    xmlDebugErr(ctxt, XML_CHECK_NO_PREV,
                    "Node has no prev and not first of parent list\n");
    } else {
        if (node->prev->next != node)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_PREV,
                        "Node prev->next : back link wrong\n");
    }
    if (node->next == NULL) {
	if ((node->parent != NULL) && (node->type != XML_ATTRIBUTE_NODE) &&
	    (node->parent->last != node) &&
	    (node->parent->type == XML_ELEMENT_NODE))
	    xmlDebugErr(ctxt, XML_CHECK_NO_NEXT,
                    "Node has no next and not last of parent list\n");
    } else {
        if (node->next->prev != node)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_NEXT,
                    "Node next->prev : forward link wrong\n");
        if (node->next->parent != node->parent)
	    xmlDebugErr(ctxt, XML_CHECK_WRONG_PARENT,
                    "Node next->prev : forward link wrong\n");
    }
    if (node->type == XML_ELEMENT_NODE) {
        xmlNsPtr ns;

	ns = node->nsDef;
	while (ns != NULL) {
	    xmlCtxtNsCheckScope(ctxt, node, ns);
	    ns = ns->next;
	}
	if (node->ns != NULL)
	    xmlCtxtNsCheckScope(ctxt, node, node->ns);
    } else if (node->type == XML_ATTRIBUTE_NODE) {
	if (node->ns != NULL)
	    xmlCtxtNsCheckScope(ctxt, node, node->ns);
    }

    if ((node->type != XML_ELEMENT_NODE) &&
	(node->type != XML_ATTRIBUTE_NODE) &&
	(node->type != XML_ELEMENT_DECL) &&
	(node->type != XML_ATTRIBUTE_DECL) &&
	(node->type != XML_DTD_NODE) &&
	(node->type != XML_HTML_DOCUMENT_NODE) &&
	(node->type != XML_DOCUMENT_NODE)) {
	if (node->content != NULL)
	    xmlCtxtCheckString(ctxt, (const xmlChar *) node->content);
    }
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    xmlCtxtCheckName(ctxt, node->name);
	    break;
        case XML_TEXT_NODE:
	    if ((node->name == xmlStringText) ||
	        (node->name == xmlStringTextNoenc))
		break;
	    /* some case of entity substitution can lead to this */
	    if ((ctxt->dict != NULL) &&
	        (node->name == xmlDictLookup(ctxt->dict, BAD_CAST "nbktext",
		                             7)))
		break;

	    xmlDebugErr3(ctxt, XML_CHECK_WRONG_NAME,
			 "Text node has wrong name '%s'",
			 (const char *) node->name);
	    break;
        case XML_COMMENT_NODE:
	    if (node->name == xmlStringComment)
		break;
	    xmlDebugErr3(ctxt, XML_CHECK_WRONG_NAME,
			 "Comment node has wrong name '%s'",
			 (const char *) node->name);
	    break;
        case XML_PI_NODE:
	    xmlCtxtCheckName(ctxt, node->name);
	    break;
        case XML_CDATA_SECTION_NODE:
	    if (node->name == NULL)
		break;
	    xmlDebugErr3(ctxt, XML_CHECK_NAME_NOT_NULL,
			 "CData section has non NULL name '%s'",
			 (const char *) node->name);
	    break;
        case XML_ENTITY_REF_NODE:
        case XML_ENTITY_NODE:
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_NOTATION_NODE:
        case XML_DTD_NODE:
        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_NAMESPACE_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
#ifdef LIBXML_DOCB_ENABLED
        case XML_DOCB_DOCUMENT_NODE:
#endif
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    break;
    }
}